

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  Curl_easy *data;
  curl_ssl_ctx_callback p_Var1;
  proxy_info *ppVar2;
  ssl_config_data *psVar3;
  ssl_config_data *psVar4;
  _Bool _Var5;
  ssl_connect_state sVar6;
  int iVar7;
  uint uVar8;
  CURLcode CVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  curl_proxytype cVar13;
  uint uVar14;
  CURLcode CVar15;
  timediff_t tVar16;
  SSL_CIPHER *c;
  char *pcVar17;
  uint *puVar18;
  SSL_METHOD *meth;
  SSL_CTX *pSVar19;
  ulong uVar20;
  BIO_METHOD *pBVar21;
  Curl_easy *pCVar22;
  Curl_easy *pCVar23;
  X509 *pXVar24;
  X509_NAME *pXVar25;
  size_t sVar26;
  undefined8 uVar27;
  ASN1_INTEGER *pAVar28;
  ASN1_STRING *pAVar29;
  X509_EXTENSION *ex;
  BIO *pBVar30;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  X509 *pXVar31;
  ASN1_TIME *pAVar32;
  EVP_PKEY *pEVar33;
  X509 *pXVar34;
  GENERAL_NAMES *a_00;
  int *piVar35;
  size_t sVar36;
  undefined8 extraout_RAX;
  undefined8 uVar37;
  PKCS12 *p12;
  X509_NAME_ENTRY *ne;
  void *__src;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar38;
  BIGNUM *pBVar39;
  stack_st_X509 *certs;
  X509_STORE *pXVar40;
  OCSP_SINGLERESP *single;
  SSL *pSVar41;
  evp_pkey_st *peVar42;
  rsa_st *r;
  UI_METHOD *method;
  UI_METHOD *pUVar43;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  ssl_backend_data *psVar44;
  ssl_primary_config *psVar45;
  long lVar46;
  undefined7 uVar48;
  char **ppcVar47;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  long lVar49;
  X509_CINF *pXVar50;
  size_t size;
  char **ppcVar51;
  size_t size_00;
  long lVar52;
  long lVar53;
  Curl_easy *pCVar54;
  long lVar55;
  long lVar56;
  curl_socket_t readfd0;
  ENGINE *e;
  long lVar57;
  long lVar58;
  long lVar59;
  char cVar60;
  X509_CINF *pXVar61;
  X509_CINF *pXVar62;
  char *pcVar63;
  BIGNUM **buffer;
  curl_socket_t *pcVar64;
  byte bVar65;
  ulong uVar66;
  bool bVar67;
  char *ptr;
  X509 *x509;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  in6_addr addr;
  EVP_PKEY *pri;
  char error_buffer [256];
  uchar protocols [128];
  size_t local_c88;
  ASN1_GENERALIZEDTIME *local_c70;
  Curl_easy *local_c68;
  Curl_easy *local_c60;
  Curl_easy *local_c58;
  Curl_easy *local_c50;
  Curl_easy *local_c48;
  long local_c40;
  X509 *local_c38;
  char *local_c30;
  char *local_c28;
  long local_c20;
  BIGNUM *local_c18;
  SSL_CTX *local_c10;
  BIO *local_c08;
  char *local_c00;
  _Bool *local_bf8;
  ASN1_GENERALIZEDTIME *local_bf0;
  Curl_easy *local_be8;
  X509 *local_be0;
  char *local_bd8;
  char *local_bd0;
  curl_socket_t *local_bc8;
  char *local_bc0;
  BIGNUM *local_bb8 [16];
  Curl_easy *local_b38;
  X509 *local_b30;
  BIGNUM *local_a38 [64];
  char local_838;
  undefined7 uStack_837;
  undefined1 uStack_830;
  undefined7 uStack_82f;
  connectdata *local_828;
  void *pvStack_820;
  undefined4 local_818;
  
  local_c68 = (Curl_easy *)CONCAT44(local_c68._4_4_,(int)CONCAT71(in_register_00000011,nonblocking))
  ;
  lVar52 = (long)sockindex;
  if (conn->ssl[lVar52].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar23 = conn->data;
  local_c48 = (Curl_easy *)CONCAT44(local_c48._4_4_,conn->sock[lVar52]);
  sVar6 = conn->ssl[lVar52].connecting_state;
  lVar55 = lVar52;
  if (sVar6 == ssl_connect_1) {
    tVar16 = Curl_timeleft(pCVar23,(curltime *)0x0,true);
    if (tVar16 < 0) {
LAB_00495aa0:
      Curl_failf(pCVar23,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pcVar64 = conn->sock + lVar52;
    pCVar54 = conn->data;
    local_be0 = (X509 *)CONCAT44(local_be0._4_4_,sockindex);
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      local_c30 = (conn->http_proxy).host.name;
      lVar55 = 0xb48;
      lVar46 = 0x3a0;
      lVar56 = 0x368;
      lVar49 = 0x370;
      lVar59 = 0xb70;
      lVar57 = 0xb68;
      lVar58 = 0x358;
      lVar53 = 0xb40;
    }
    else {
      local_c30 = (conn->host).name;
      lVar55 = 0xaa0;
      lVar46 = 0x350;
      lVar56 = 0x318;
      lVar49 = 800;
      lVar59 = 0xac8;
      lVar57 = 0xac0;
      lVar58 = 0x308;
      lVar53 = 0xa98;
    }
    local_c50 = (Curl_easy *)CONCAT44(local_c50._4_4_,*pcVar64);
    local_c08 = *(BIO **)((conn->chunk).hexbuffer + lVar56 + -0x20);
    local_c58 = *(Curl_easy **)((long)&pCVar54->next + lVar59);
    uVar20 = *(ulong *)((conn->chunk).hexbuffer + lVar58 + -0x20);
    local_c60 = *(Curl_easy **)((long)&pCVar54->next + lVar57);
    local_c28 = *(char **)((conn->chunk).hexbuffer + lVar49 + -0x20);
    bVar65 = (conn->chunk).hexbuffer[lVar46 + -0x20];
    pcVar63 = *(char **)((long)&pCVar54->next + lVar55);
    local_c40 = lVar52 * 3;
    local_c20 = lVar52;
    local_bf8 = done;
    CVar9 = Curl_ossl_seed(pCVar54);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    *(undefined8 *)((long)&pCVar54->next + lVar53) = 1;
    local_bd0 = pcVar63;
    local_bc8 = pcVar64;
    if (7 < uVar20) {
      Curl_failf(pCVar54,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
    if ((0xf3UL >> (uVar20 & 0x3f) & 1) == 0) {
      if (uVar20 == 2) {
        pcVar63 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar63 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar54,pcVar63);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar19 = (SSL_CTX *)(conn->ssl[lVar52].backend)->ctx;
    if (pSVar19 != (SSL_CTX *)0x0) {
      SSL_CTX_free(pSVar19);
    }
    pSVar19 = SSL_CTX_new(meth);
    pcVar64 = local_bc8;
    (conn->ssl[lVar52].backend)->ctx = (SSL_CTX *)pSVar19;
    if (pSVar19 == (SSL_CTX *)0x0) {
      uVar20 = ERR_peek_error();
      ERR_error_string_n(uVar20,(char *)local_a38,0x100);
      Curl_failf(pCVar54,"SSL: couldn\'t create a context: %s",local_a38);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar19,0x21,0x10,(void *)0x0);
    if (((pCVar54->set).fdebug != (curl_debug_callback)0x0) &&
       (((pCVar54->set).field_0x87b & 0x40) != 0)) {
      SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,ssl_tls_trace);
      SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,0x10,0,conn);
    }
    uVar8 = bVar65 & 1;
    uVar66 = 0x80024850;
    cVar13 = (conn->http_proxy).proxytype;
    if ((cVar13 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar65 = (pCVar54->set).proxy_ssl.field_0xa0;
    }
    else {
      bVar65 = (pCVar54->set).ssl.field_0xa0;
    }
    if ((bVar65 & 4) == 0) {
      uVar66 = 0x80024050;
    }
    if ((0xf3UL >> (uVar20 & 0x3f) & 1) == 0) {
      if (uVar20 == 2) {
        uVar20 = uVar66 | 0x3e000000;
      }
      else {
        uVar20 = uVar66 | 0x3c000000;
      }
    }
    else {
      if (cVar13 == CURLPROXY_HTTPS) {
        bVar67 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        psVar45 = &conn->proxy_ssl_config;
        if (bVar67) {
          psVar45 = &conn->ssl_config;
        }
        lVar55 = 0x360;
        if (bVar67) {
          lVar55 = 0x310;
        }
      }
      else {
        psVar45 = &conn->ssl_config;
        lVar55 = 0x310;
      }
      uVar20 = uVar66 | 0x2000000;
      lVar46 = psVar45->version;
      lVar55 = *(long *)((conn->chunk).hexbuffer + lVar55 + -0x20);
      if (lVar46 == 5) {
LAB_00495ef8:
        uVar20 = uVar20 | 0x4000000;
      }
      else {
        if (lVar46 == 6) {
LAB_00495ef1:
          uVar20 = uVar20 | 0x10000000;
          goto LAB_00495ef8;
        }
        if (lVar46 == 7) {
          SSL_CTX_ctrl((SSL_CTX *)(&conn->ssl[0].backend)[local_c40]->ctx,0x7c,0x304,(void *)0x0);
          uVar20 = uVar66 | 0xa000000;
          goto LAB_00495ef1;
        }
      }
      if (lVar55 != 0x60000) {
        if (lVar55 != 0x50000) {
          if (lVar55 != 0x40000) goto LAB_00496d51;
          uVar20 = uVar20 | 0x10000000;
        }
        uVar20 = uVar20 | 0x8000000;
      }
      uVar20 = uVar20 | 0x20000000;
    }
LAB_00496d51:
    SSL_CTX_set_options((conn->ssl[lVar52].backend)->ctx,uVar20);
    uVar14 = *(uint *)&(conn->bits).field_0x4;
    if ((uVar14 >> 0x1c & 1) != 0) {
      SSL_CTX_set_next_proto_select_cb
                ((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,select_next_proto_cb,conn);
      uVar14 = *(uint *)&(conn->bits).field_0x4;
    }
    if ((uVar14 >> 0x1d & 1) != 0) {
      local_838 = '\b';
      uStack_837 = 0x2e312f70747468;
      uStack_830 = 0x31;
      Curl_infof(pCVar54,"ALPN, offering %s\n","http/1.1");
      SSL_CTX_set_alpn_protos((conn->ssl[lVar52].backend)->ctx,&stack0xfffffffffffff7c8,9);
    }
    if (local_c60 != (Curl_easy *)0x0 || local_c58 != (Curl_easy *)0x0) {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        psVar3 = &(pCVar54->set).ssl;
        psVar4 = &(pCVar54->set).ssl;
        bVar67 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar67) {
          psVar4 = &(pCVar54->set).proxy_ssl;
          psVar3 = &(pCVar54->set).proxy_ssl;
        }
        ppcVar47 = &psVar3->key;
        ppcVar51 = &psVar4->key_type;
        lVar55 = 0xb88;
        if (bVar67) {
          lVar55 = 0xae0;
        }
      }
      else {
        ppcVar47 = &(pCVar54->set).ssl.key;
        ppcVar51 = &(pCVar54->set).ssl.key_type;
        lVar55 = 0xae0;
      }
      local_c10 = (SSL_CTX *)(conn->ssl[lVar52].backend)->ctx;
      bVar67 = local_c60 != (Curl_easy *)0x0;
      pCVar22 = (Curl_easy *)*ppcVar47;
      local_bd8 = *ppcVar51;
      pcVar63 = *(char **)((long)&pCVar54->next + lVar55);
      data = conn->data;
      iVar7 = do_file_type((char *)local_c58);
      pSVar19 = local_c10;
      pcVar64 = local_bc8;
      if (iVar7 == 0x2a || bVar67) {
        if (pcVar63 != (char *)0x0) {
          SSL_CTX_set_default_passwd_cb_userdata(local_c10,pcVar63);
          SSL_CTX_set_default_passwd_cb(pSVar19,passwd_callback);
        }
        if (iVar7 < 0x2a) {
          if (iVar7 == 1) {
            local_c58 = (Curl_easy *)CONCAT44(local_c58._4_4_,1);
            local_c00 = pcVar63;
            local_be8 = pCVar23;
            iVar7 = SSL_CTX_use_certificate_chain_file(pSVar19,(char *)local_c60);
            bVar67 = true;
            if (iVar7 != 1) {
              uVar20 = ERR_get_error();
              ERR_error_string_n(uVar20,&stack0xfffffffffffff7c8,0x100);
              pcVar63 = 
              "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
LAB_00497451:
              pCVar23 = (Curl_easy *)&stack0xfffffffffffff7c8;
              goto LAB_00497459;
            }
          }
          else {
            if (iVar7 != 2) goto LAB_00497275;
            local_c58 = (Curl_easy *)CONCAT44(local_c58._4_4_,2);
            local_c00 = pcVar63;
            local_be8 = pCVar23;
            iVar7 = SSL_CTX_use_certificate_file(pSVar19,(char *)local_c60,2);
            bVar67 = true;
            if (iVar7 != 1) {
              uVar20 = ERR_get_error();
              ERR_error_string_n(uVar20,&stack0xfffffffffffff7c8,0x100);
              pcVar63 = 
              "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
              goto LAB_00497451;
            }
          }
        }
        else {
          if (iVar7 != 0x2a) {
            if (iVar7 == 0x2b) {
              local_c58 = (Curl_easy *)CONCAT44(local_c58._4_4_,0x2b);
              local_c70 = (ASN1_GENERALIZEDTIME *)0x0;
              local_c00 = pcVar63;
              pBVar21 = BIO_s_file();
              pBVar30 = BIO_new(pBVar21);
              if (pBVar30 != (BIO *)0x0) {
                lVar55 = BIO_ctrl(pBVar30,0x6c,3,local_c60);
                if ((int)lVar55 < 1) {
                  Curl_failf(data,"could not open PKCS12 file \'%s\'",local_c60);
                  BIO_free(pBVar30);
                  return CURLE_SSL_CERTPROBLEM;
                }
                p12 = d2i_PKCS12_bio(pBVar30,(PKCS12 **)0x0);
                BIO_free(pBVar30);
                if (p12 == (PKCS12 *)0x0) {
                  pcVar63 = "error reading PKCS12 file \'%s\'";
                  pCVar23 = local_c60;
                  goto LAB_00497459;
                }
                PKCS12_PBE_add();
                iVar7 = PKCS12_parse(p12,local_c00,(EVP_PKEY **)&local_b38,&local_c38,
                                     (stack_st_X509 **)&local_c70);
                if (iVar7 == 0) {
                  uVar20 = ERR_get_error();
                  ERR_error_string_n(uVar20,&stack0xfffffffffffff7c8,0x100);
                  Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",
                             &stack0xfffffffffffff7c8);
                  PKCS12_free(p12);
                  return CURLE_SSL_CERTPROBLEM;
                }
                PKCS12_free(p12);
                pSVar19 = local_c10;
                iVar7 = SSL_CTX_use_certificate(local_c10,local_c38);
                if (iVar7 == 1) {
                  local_be8 = pCVar23;
                  iVar7 = SSL_CTX_use_PrivateKey(pSVar19,(EVP_PKEY *)local_b38);
                  if (iVar7 == 1) {
                    iVar7 = SSL_CTX_check_private_key(local_c10);
                    pSVar19 = local_c10;
                    if (iVar7 != 0) {
                      if (local_c70 != (ASN1_GENERALIZEDTIME *)0x0) {
                        do {
                          iVar7 = OPENSSL_sk_num(local_c70);
                          if (iVar7 == 0) goto LAB_0049898a;
                          pXVar24 = (X509 *)OPENSSL_sk_pop(local_c70);
                          iVar7 = SSL_CTX_add_client_CA(pSVar19,pXVar24);
                          if (iVar7 == 0) {
                            X509_free(pXVar24);
                            pcVar63 = "cannot add certificate to client CA list";
                            goto LAB_004989d0;
                          }
                          lVar55 = SSL_CTX_ctrl(pSVar19,0xe,0,pXVar24);
                        } while (lVar55 != 0);
                        X509_free(pXVar24);
                        pcVar63 = "cannot add certificate to certificate chain";
LAB_004989d0:
                        Curl_failf(data,pcVar63);
                        goto LAB_00498960;
                      }
LAB_0049898a:
                      EVP_PKEY_free((EVP_PKEY *)local_b38);
                      X509_free(local_c38);
                      OPENSSL_sk_pop_free(local_c70,X509_free);
                      bVar67 = false;
                      pSVar19 = local_c10;
                      goto LAB_004972b3;
                    }
                    pcVar63 = 
                    "private key from PKCS12 file \'%s\' does not match certificate in same file";
                    pCVar23 = local_c60;
                  }
                  else {
                    pcVar63 = "unable to use private key from PKCS12 file \'%s\'";
                    pCVar23 = local_c60;
                  }
                }
                else {
                  uVar20 = ERR_get_error();
                  ERR_error_string_n(uVar20,&stack0xfffffffffffff7c8,0x100);
                  pcVar63 = "could not load PKCS12 client certificate, OpenSSL error %s";
                  pCVar23 = (Curl_easy *)&stack0xfffffffffffff7c8;
                }
                Curl_failf(data,pcVar63,pCVar23);
LAB_00498960:
                EVP_PKEY_free((EVP_PKEY *)local_b38);
                X509_free(local_c38);
                OPENSSL_sk_pop_free(local_c70,X509_free);
                return CURLE_SSL_CERTPROBLEM;
              }
              uVar20 = ERR_get_error();
              ERR_error_string_n(uVar20,&stack0xfffffffffffff7c8,0x100);
              pcVar63 = "BIO_new return NULL, OpenSSL error %s";
              goto LAB_00497451;
            }
LAB_00497275:
            pcVar63 = "not supported file type \'%s\' for certificate";
            pCVar23 = local_c58;
LAB_00497459:
            Curl_failf(data,pcVar63,pCVar23);
            return CURLE_SSL_CERTPROBLEM;
          }
          local_c58 = (Curl_easy *)CONCAT44(local_c58._4_4_,0x2a);
          e = (ENGINE *)(data->state).engine;
          local_c00 = pcVar63;
          if (e == (ENGINE *)0x0) {
            if (local_c60 != (Curl_easy *)0x0) {
              iVar7 = Curl_strncasecompare((char *)local_c60,"pkcs11:",7);
              if ((iVar7 != 0) && (CVar9 = Curl_ossl_set_engine(data,"pkcs11"), CVar9 != CURLE_OK))
              {
                return CURLE_SSL_CERTPROBLEM;
              }
              e = (ENGINE *)(data->state).engine;
              pSVar19 = local_c10;
              if (e != (ENGINE *)0x0) goto LAB_004972ef;
            }
            pcVar63 = "crypto engine not set, can\'t load certificate";
            goto LAB_00498914;
          }
LAB_004972ef:
          local_b38 = local_c60;
          local_b30 = (X509 *)0x0;
          iVar7 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
          if (iVar7 == 0) {
            pcVar63 = "ssl engine does not support loading certificates";
            goto LAB_00498914;
          }
          iVar7 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,&local_b38,
                                  (f *)0x0,1);
          if (iVar7 == 0) {
            uVar20 = ERR_get_error();
            pcVar63 = &stack0xfffffffffffff7c8;
            ERR_error_string_n(uVar20,pcVar63,0x100);
            pcVar17 = "ssl engine cannot load client cert with id \'%s\' [%s]";
            pCVar22 = local_c60;
            goto LAB_00498071;
          }
          if (local_b30 == (X509 *)0x0) {
            pcVar63 = "ssl engine didn\'t initialized the certificate properly.";
            goto LAB_00498914;
          }
          local_be8 = pCVar23;
          iVar7 = SSL_CTX_use_certificate(pSVar19,local_b30);
          if (iVar7 != 1) {
            Curl_failf(data,"unable to set client certificate");
            X509_free(local_b30);
            return CURLE_SSL_CERTPROBLEM;
          }
          X509_free(local_b30);
          bVar67 = true;
        }
LAB_004972b3:
        if (pCVar22 == (Curl_easy *)0x0) {
          pCVar22 = local_c60;
          iVar7 = (int)local_c58;
        }
        else {
          iVar7 = do_file_type(local_bd8);
        }
        if (iVar7 < 0x2a) {
          if (iVar7 == 1) {
            if (!bVar67) goto LAB_00497e7c;
          }
          else if (iVar7 != 2) {
LAB_00497e55:
            pcVar63 = "not supported file type for private key";
            goto LAB_00498914;
          }
          iVar7 = SSL_CTX_use_PrivateKey_file(pSVar19,(char *)pCVar22,iVar7);
          if (iVar7 != 1) {
            pcVar63 = "PEM";
            if (local_bd8 != (char *)0x0) {
              pcVar63 = local_bd8;
            }
            pcVar17 = "unable to set private key file: \'%s\' type %s";
LAB_00498071:
            Curl_failf(data,pcVar17,pCVar22,pcVar63);
            return CURLE_SSL_CERTPROBLEM;
          }
        }
        else if (iVar7 == 0x2a) {
          if ((data->state).engine == (void *)0x0) {
            if (pCVar22 != (Curl_easy *)0x0) {
              iVar7 = Curl_strncasecompare((char *)pCVar22,"pkcs11:",7);
              if ((iVar7 != 0) && (CVar9 = Curl_ossl_set_engine(data,"pkcs11"), CVar9 != CURLE_OK))
              {
                return CURLE_SSL_CERTPROBLEM;
              }
              if ((data->state).engine != (void *)0x0) goto LAB_00497f32;
            }
            pcVar63 = "crypto engine not set, can\'t load private key";
            goto LAB_00498914;
          }
LAB_00497f32:
          method = UI_create_method("curl user interface");
          if (method == (UI_METHOD *)0x0) {
            pcVar63 = "unable do create OpenSSL user-interface method";
            goto LAB_00498914;
          }
          pUVar43 = UI_OpenSSL();
          iVar7 = UI_method_get_opener((UI *)pUVar43);
          UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar7));
          pUVar43 = UI_OpenSSL();
          iVar7 = UI_method_get_closer((UI *)pUVar43);
          UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar7));
          UI_method_set_reader(method,ssl_ui_reader);
          UI_method_set_writer(method,ssl_ui_writer);
          pEVar33 = ENGINE_load_private_key
                              ((ENGINE *)(data->state).engine,(char *)pCVar22,method,local_c00);
          UI_destroy_method(method);
          if (pEVar33 == (EVP_PKEY *)0x0) {
            pcVar63 = "failed to load private key from crypto engine";
            goto LAB_00498914;
          }
          iVar7 = SSL_CTX_use_PrivateKey(local_c10,pEVar33);
          if (iVar7 != 1) {
            Curl_failf(data,"unable to set private key");
            EVP_PKEY_free(pEVar33);
            return CURLE_SSL_CERTPROBLEM;
          }
          EVP_PKEY_free(pEVar33);
          pSVar19 = local_c10;
        }
        else {
          if (iVar7 != 0x2b) goto LAB_00497e55;
          if (bVar67) {
            pcVar63 = "file type P12 for private key not supported";
            goto LAB_00498914;
          }
        }
LAB_00497e7c:
        pSVar41 = SSL_new(pSVar19);
        if (pSVar41 == (SSL *)0x0) {
          pcVar63 = "unable to create an SSL structure";
          goto LAB_00498914;
        }
        local_c38 = SSL_get_certificate(pSVar41);
        if (local_c38 != (X509 *)0x0) {
          pEVar33 = X509_get_pubkey(local_c38);
          peVar42 = SSL_get_privatekey(pSVar41);
          EVP_PKEY_copy_parameters(pEVar33,peVar42);
          EVP_PKEY_free(pEVar33);
        }
        peVar42 = SSL_get_privatekey(pSVar41);
        iVar7 = EVP_PKEY_get_id(peVar42);
        pCVar23 = local_be8;
        if (iVar7 == 6) {
          r = EVP_PKEY_get1_RSA(peVar42);
          uVar14 = RSA_flags(r);
          RSA_free(r);
          SSL_free(pSVar41);
          pcVar64 = local_bc8;
          if ((uVar14 & 1) != 0) goto LAB_004980c9;
        }
        else {
          SSL_free(pSVar41);
        }
        iVar7 = SSL_CTX_check_private_key(local_c10);
        pcVar64 = local_bc8;
        if (iVar7 == 0) {
          pcVar63 = "Private key does not match the certificate public key";
LAB_00498914:
          Curl_failf(data,pcVar63);
          return CURLE_SSL_CERTPROBLEM;
        }
      }
    }
LAB_004980c9:
    cVar13 = (conn->http_proxy).proxytype;
    if ((cVar13 != CURLPROXY_HTTPS) ||
       (lVar55 = 0x390, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar55 = 0x340;
    }
    pcVar63 = *(char **)((conn->chunk).hexbuffer + lVar55 + -0x20);
    if (pcVar63 != (char *)0x0) {
      iVar7 = SSL_CTX_set_cipher_list((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,pcVar63);
      if (iVar7 == 0) {
        pcVar17 = "failed setting cipher list: %s";
        goto LAB_0049825a;
      }
      Curl_infof(pCVar54,"Cipher selection: %s\n",pcVar63);
      cVar13 = (conn->http_proxy).proxytype;
    }
    if ((cVar13 != CURLPROXY_HTTPS) ||
       (lVar55 = 0x398, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar55 = 0x348;
    }
    pcVar63 = *(char **)((conn->chunk).hexbuffer + lVar55 + -0x20);
    if (pcVar63 != (char *)0x0) {
      iVar7 = SSL_CTX_set_ciphersuites((conn->ssl[lVar52].backend)->ctx,pcVar63);
      if (iVar7 == 0) {
        pcVar17 = "failed setting TLS 1.3 cipher suite: %s";
LAB_0049825a:
        Curl_failf(pCVar54,pcVar17,pcVar63);
        return CURLE_SSL_CIPHER;
      }
      Curl_infof(pCVar54,"TLS 1.3 cipher selection: %s\n",pcVar63);
    }
    SSL_CTX_set_post_handshake_auth((conn->ssl[lVar52].backend)->ctx,1);
    pcVar63 = local_bd0;
    if (local_c28 != (char *)0x0 || local_c08 != (BIO *)0x0) {
      iVar7 = SSL_CTX_load_verify_locations
                        ((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,local_c28,(char *)local_c08);
      if ((iVar7 == 0) && ((char)uVar8 != '\0')) {
        pcVar63 = local_c28;
        if (local_c28 == (char *)0x0) {
          pcVar63 = "none";
        }
        pBVar30 = (BIO *)"none";
        if (local_c08 != (BIO *)0x0) {
          pBVar30 = local_c08;
        }
        Curl_failf(pCVar54,"error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s"
                   ,pcVar63,pBVar30);
        return CURLE_SSL_CACERT_BADFILE;
      }
      pcVar17 = "error setting certificate verify locations, continuing anyway:\n";
      if (iVar7 != 0) {
        pcVar17 = "successfully set certificate verify locations:\n";
      }
      Curl_infof(pCVar54,pcVar17);
      pcVar17 = local_c28;
      if (local_c28 == (char *)0x0) {
        pcVar17 = "none";
      }
      Curl_infof(pCVar54,"  CAfile: %s\n  CApath: %s\n",pcVar17);
    }
    if (pcVar63 != (char *)0x0) {
      pXVar40 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx);
      m = X509_LOOKUP_file();
      pcVar63 = local_bd0;
      ctx = X509_STORE_add_lookup(pXVar40,m);
      if ((ctx == (X509_LOOKUP *)0x0) || (iVar7 = X509_load_crl_file(ctx,pcVar63,1), iVar7 == 0)) {
        Curl_failf(pCVar54,"error loading CRL file: %s",pcVar63);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(pCVar54,"successfully load CRL file:\n");
      pXVar40 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx);
      X509_STORE_set_flags(pXVar40,0xc);
      Curl_infof(pCVar54,"  CRLfile: %s\n",pcVar63);
    }
    SSL_CTX_set_verify((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,uVar8,(callback *)0x0);
    if (keylog_file_fp != (FILE *)0x0) {
      SSL_CTX_set_keylog_callback((conn->ssl[lVar52].backend)->ctx,ossl_keylog_callback);
    }
    SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,0x2c,0x301,(void *)0x0);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx,ossl_new_session_cb);
    p_Var1 = (pCVar54->set).ssl.fsslctx;
    if ((p_Var1 != (curl_ssl_ctx_callback)0x0) &&
       (CVar9 = (*p_Var1)(pCVar54,(conn->ssl[lVar52].backend)->ctx,(pCVar54->set).ssl.fsslctxp),
       CVar9 != CURLE_OK)) {
      Curl_failf(pCVar54,"error signaled by ssl ctx callback");
      return CVar9;
    }
    psVar44 = conn->ssl[lVar52].backend;
    if ((SSL *)psVar44->handle != (SSL *)0x0) {
      SSL_free((SSL *)psVar44->handle);
      psVar44 = conn->ssl[lVar52].backend;
    }
    pSVar41 = SSL_new((SSL_CTX *)psVar44->ctx);
    (conn->ssl[lVar52].backend)->handle = (SSL *)pSVar41;
    if (pSVar41 == (SSL *)0x0) {
      Curl_failf(pCVar54,"SSL: couldn\'t create a context (handle)!");
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar65 = (conn->proxy_ssl_config).field_0x48;
    }
    else {
      bVar65 = (conn->ssl_config).field_0x48;
    }
    if ((bVar65 & 4) != 0) {
      SSL_ctrl(pSVar41,0x41,1,(void *)0x0);
      pSVar41 = (SSL *)(conn->ssl[lVar52].backend)->handle;
    }
    SSL_set_connect_state(pSVar41);
    pcVar63 = local_c30;
    (conn->ssl[lVar52].backend)->server_cert = (X509 *)0x0;
    iVar7 = inet_pton(2,local_c30,local_bb8);
    if (((iVar7 == 0) && (iVar7 = inet_pton(10,pcVar63,local_bb8), iVar7 == 0)) &&
       (lVar55 = SSL_ctrl((SSL *)(conn->ssl[lVar52].backend)->handle,0x37,0,pcVar63), lVar55 == 0))
    {
      Curl_infof(pCVar54,"WARNING: failed to configure server name indication (SNI) TLS extension\n"
                );
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar65 = (pCVar54->set).proxy_ssl.primary.field_0x48;
    }
    else {
      bVar65 = (pCVar54->set).ssl.primary.field_0x48;
    }
    if ((bVar65 & 8) != 0) {
      local_838 = '\0';
      uStack_837 = 0;
      uVar8 = ossl_get_ssl_conn_index();
      uVar14 = ossl_get_ssl_sockindex_index();
      if (-1 < (int)(uVar8 | uVar14)) {
        SSL_set_ex_data((SSL *)(conn->ssl[lVar52].backend)->handle,uVar8,conn);
        SSL_set_ex_data((SSL *)(conn->ssl[lVar52].backend)->handle,uVar14,pcVar64);
      }
      Curl_ssl_sessionid_lock(conn);
      _Var5 = Curl_ssl_getsessionid
                        (conn,(void **)&stack0xfffffffffffff7c8,(size_t *)0x0,(int)local_be0);
      if (!_Var5) {
        iVar7 = SSL_set_session((SSL *)(conn->ssl[lVar52].backend)->handle,
                                (SSL_SESSION *)CONCAT71(uStack_837,local_838));
        if (iVar7 == 0) {
          Curl_ssl_sessionid_unlock(conn);
          uVar20 = ERR_get_error();
          ERR_error_string_n(uVar20,(char *)local_a38,0x100);
          pcVar63 = "SSL: SSL_set_session failed: %s";
          goto LAB_00498759;
        }
        Curl_infof(pCVar54,"SSL re-using session ID\n");
      }
      Curl_ssl_sessionid_unlock(conn);
    }
    lVar55 = local_c40;
    if (((&conn->proxy_ssl[0].field_0x10)[local_c40 * 8] & 1) == 0) {
      iVar7 = SSL_set_fd((SSL *)(conn->ssl[lVar52].backend)->handle,(int)local_c50);
      if (iVar7 == 0) {
        uVar20 = ERR_get_error();
        ERR_error_string_n(uVar20,(char *)local_a38,0x100);
        pcVar63 = "SSL: SSL_set_fd failed: %s";
LAB_00498759:
        Curl_failf(pCVar54,pcVar63,local_a38);
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    else {
      pBVar21 = BIO_f_ssl();
      pBVar30 = BIO_new(pBVar21);
      BIO_ctrl(pBVar30,0x6d,0,(&conn->proxy_ssl[0].backend)[lVar55]->handle);
      SSL_set_bio((SSL *)(conn->ssl[lVar52].backend)->handle,pBVar30,pBVar30);
    }
    conn->ssl[lVar52].connecting_state = ssl_connect_2;
    sVar6 = ssl_connect_2;
    lVar55 = local_c20;
    done = local_bf8;
  }
  local_c20 = lVar55;
  local_bf8 = done;
  while (sVar6 - ssl_connect_2 < 3) {
    tVar16 = Curl_timeleft(pCVar23,(curltime *)0x0,true);
    if (tVar16 < 0) goto LAB_00495aa0;
    sVar6 = conn->ssl[lVar52].connecting_state;
    if ((sVar6 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar6 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_c48;
      }
      readfd0 = -1;
      if (sVar6 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_c48;
      }
      if ((char)local_c68 != '\0') {
        tVar16 = 0;
      }
      iVar7 = Curl_socket_check(readfd0,-1,writefd,tVar16);
      if (iVar7 < 0) {
        puVar18 = (uint *)__errno_location();
        Curl_failf(pCVar23,"select/poll on SSL socket, errno: %d",(ulong)*puVar18);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar7 == 0) {
        if ((char)local_c68 != '\0') {
          *local_bf8 = false;
          return CURLE_OK;
        }
        goto LAB_00495aa0;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar55 = 0xb40, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar55 = 0xa98;
    }
    pCVar54 = conn->data;
    ERR_clear_error();
    iVar7 = SSL_connect((SSL *)(conn->ssl[lVar52].backend)->handle);
    if (iVar7 == 1) {
      conn->ssl[lVar52].connecting_state = ssl_connect_3;
      pSVar41 = (SSL *)(conn->ssl[lVar52].backend)->handle;
      pcVar63 = "";
      if (pSVar41 != (SSL *)0x0) {
        iVar7 = SSL_version(pSVar41);
        pcVar63 = "TLSv1.3";
        switch(iVar7) {
        case 0x300:
          pcVar63 = "SSLv3";
          break;
        case 0x301:
          pcVar63 = "TLSv1.0";
          break;
        case 0x302:
          pcVar63 = "TLSv1.1";
          break;
        case 0x303:
          pcVar63 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar7 == 2) {
            pcVar63 = "SSLv2";
          }
          else {
            pcVar63 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)(conn->ssl[lVar52].backend)->handle);
      pcVar17 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar54,"SSL connection using %s / %s\n",pcVar63,pcVar17);
      if (((conn->bits).field_0x7 & 0x20) != 0) {
        SSL_get0_alpn_selected
                  ((conn->ssl[lVar52].backend)->handle,&stack0xfffffffffffff7c8,local_a38);
        if ((int)local_a38[0] == 0) {
          Curl_infof(pCVar54,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar54,"ALPN, server accepted to use %.*s\n",(ulong)local_a38[0] & 0xffffffff,
                     CONCAT71(uStack_837,local_838));
          if (((int)local_a38[0] == 8) &&
             (*(long *)CONCAT71(uStack_837,local_838) == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
        Curl_multiuse_state(conn,(uint)(conn->negnpn == 3) * 3 + -1);
      }
    }
    else {
      uVar8 = SSL_get_error((SSL *)(conn->ssl[lVar52].backend)->handle,iVar7);
      if (uVar8 == 9) {
        conn->ssl[lVar52].connecting_state = ssl_connect_2;
      }
      else if (uVar8 == 3) {
        conn->ssl[lVar52].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar8 != 2) {
          memset(&stack0xfffffffffffff7c8,0,0x100);
          conn->ssl[lVar52].connecting_state = ssl_connect_2;
          uVar20 = ERR_get_error();
          uVar14 = (uint)uVar20;
          if (((-1 < (int)uVar14) && ((uVar14 & 0xff800000) == 0xa000000)) &&
             ((uVar14 & 0x7fffff) == 0x86)) {
            lVar52 = SSL_get_verify_result((SSL *)(conn->ssl[lVar52].backend)->handle);
            if (lVar52 == 0) {
              local_828 = (connectdata *)0x6163696669726576;
              pvStack_820 = (void *)0x696166206e6f6974;
              local_838 = 'S';
              uStack_837 = 0x74726563204c53;
              uStack_830 = 0x69;
              uStack_82f = 0x20657461636966;
              local_818 = 0x64656c;
            }
            else {
              *(long *)((long)&pCVar54->next + lVar55) = lVar52;
              pcVar63 = X509_verify_cert_error_string(lVar52);
              curl_msnprintf(&stack0xfffffffffffff7c8,0x100,"SSL certificate problem: %s",pcVar63);
            }
            CVar9 = CURLE_PEER_FAILED_VERIFICATION;
LAB_00496d29:
            Curl_failf(pCVar54,"%s",&stack0xfffffffffffff7c8);
            return CVar9;
          }
          ERR_error_string_n(uVar20,&stack0xfffffffffffff7c8,0x100);
          CVar9 = CURLE_SSL_CONNECT_ERROR;
          if (uVar20 != 0) goto LAB_00496d29;
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar67 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar2 = &conn->http_proxy;
            if (bVar67) {
              ppVar2 = (proxy_info *)&conn->host;
            }
            pcVar63 = (ppVar2->host).name;
            if (!bVar67) {
              lVar52 = conn->port;
              goto LAB_00497242;
            }
          }
          else {
            pcVar63 = (conn->host).name;
          }
          lVar52 = (long)conn->remote_port;
LAB_00497242:
          if (uVar8 < 0xb) {
            pcVar17 = (&PTR_anon_var_dwarf_17aad18_0062b698)[uVar8];
          }
          else {
            pcVar17 = "SSL_ERROR unknown";
          }
          Curl_failf(pCVar54,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar17,pcVar63,
                     lVar52);
          return CURLE_SSL_CONNECT_ERROR;
        }
        conn->ssl[lVar52].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar6 = conn->ssl[lVar52].connecting_state;
    if (((char)local_c68 != '\0') && (sVar6 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar6 == ssl_connect_3) {
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar65 = (conn->proxy_ssl_config).field_0x48;
      if ((bVar65 & 1) != 0) {
        pCVar23 = conn->data;
        memset(&local_b38,0,0x100);
        local_c30 = (char *)0xb40;
        goto LAB_00496062;
      }
      pCVar23 = conn->data;
      memset(&local_b38,0,0x100);
      local_c30 = (char *)0xb40;
LAB_00495f6c:
      bVar65 = (bVar65 & 2) >> 1;
    }
    else {
      bVar65 = (conn->ssl_config).field_0x48;
      if ((bVar65 & 1) == 0) {
        pCVar23 = conn->data;
        memset(&local_b38,0,0x100);
        local_c30 = (char *)0xa98;
        goto LAB_00495f6c;
      }
      pCVar23 = conn->data;
      memset(&local_b38,0,0x100);
      local_c30 = (char *)0xa98;
LAB_00496062:
      bVar65 = 1;
    }
    pBVar21 = BIO_s_mem();
    local_c08 = BIO_new(pBVar21);
    if (((pCVar23->set).ssl.field_0xa0 & 1) != 0) {
      pCVar54 = conn->data;
      pCVar22 = (Curl_easy *)SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar52].backend)->handle);
      if (pCVar22 != (Curl_easy *)0x0) {
        iVar7 = OPENSSL_sk_num(pCVar22);
        CVar9 = Curl_ssl_init_certinfo(pCVar54,iVar7);
        if (CVar9 == CURLE_OK) {
          local_c40 = CONCAT71(local_c40._1_7_,bVar65);
          local_c50 = pCVar23;
          pBVar21 = BIO_s_mem();
          pCVar23 = (Curl_easy *)BIO_new(pBVar21);
          if (0 < iVar7) {
            iVar10 = 0;
            local_c28 = (char *)CONCAT44(local_c28._4_4_,iVar7);
            local_c60 = pCVar23;
            local_c58 = pCVar22;
            local_c48 = pCVar54;
            do {
              pXVar24 = (X509 *)OPENSSL_sk_value(local_c58,iVar10);
              local_bf0 = (ASN1_GENERALIZEDTIME *)0x0;
              pXVar25 = X509_get_subject_name(pXVar24);
              X509_NAME_print_ex((BIO *)pCVar23,pXVar25,0,0x82031f);
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              Curl_ssl_push_certinfo_len(pCVar54,iVar10,"Subject",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              pXVar25 = X509_get_issuer_name(pXVar24);
              X509_NAME_print_ex((BIO *)pCVar23,pXVar25,0,0x82031f);
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              Curl_ssl_push_certinfo_len(pCVar54,iVar10,"Issuer",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              uVar27 = X509_get_version(pXVar24);
              BIO_printf((BIO *)pCVar23,"%lx",uVar27);
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              local_c68 = (Curl_easy *)CONCAT44(local_c68._4_4_,iVar10);
              Curl_ssl_push_certinfo_len(pCVar54,iVar10,"Version",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              pAVar28 = X509_get_serialNumber(pXVar24);
              if (pAVar28->type == 0x102) {
                BIO_puts((BIO *)pCVar23,"-");
              }
              if (0 < pAVar28->length) {
                lVar55 = 0;
                do {
                  BIO_printf((BIO *)pCVar23,"%02x",(ulong)pAVar28->data[lVar55]);
                  lVar55 = lVar55 + 1;
                } while (lVar55 < pAVar28->length);
              }
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              iVar7 = (int)local_c68;
              Curl_ssl_push_certinfo_len
                        (pCVar54,(int)local_c68,"Serial Number",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              local_c18 = (BIGNUM *)0x0;
              pAVar29 = ASN1_STRING_new();
              if (pAVar29 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_bf0,&local_c18,pXVar24);
                X509_signature_print((BIO *)pCVar23,(X509_ALGOR *)local_c18,pAVar29);
                ASN1_STRING_free(pAVar29);
                if (local_c18 != (BIGNUM *)0x0) {
                  i2a_ASN1_OBJECT((BIO *)pCVar23,(ASN1_OBJECT *)local_c18->d);
                  sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
                  Curl_ssl_push_certinfo_len
                            (pCVar54,iVar7,"Public Key Algorithm",(char *)local_c70,sVar26);
                  BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
                }
              }
              uVar27 = X509_get0_extensions(pXVar24);
              iVar10 = OPENSSL_sk_num(uVar27);
              if ((0 < iVar10) && (iVar10 = OPENSSL_sk_num(uVar27), 0 < iVar10)) {
                iVar10 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar27,iVar10);
                  pBVar21 = BIO_s_mem();
                  pBVar30 = BIO_new(pBVar21);
                  if (pBVar30 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_bb8,0x80,a);
                  iVar7 = X509V3_EXT_print(pBVar30,ex,0,0);
                  if (iVar7 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(pBVar30,v);
                  }
                  BIO_ctrl(pBVar30,0x73,0,&local_c38);
                  pXVar50 = local_c38->cert_info;
                  if (pXVar50 != (X509_CINF *)0x0) {
                    buffer = local_a38;
                    pXVar61 = (X509_CINF *)0x0;
                    pXVar31 = local_c38;
                    do {
                      bVar67 = *(char *)((long)&pXVar31->sig_alg->algorithm + (long)pXVar61) == '\n'
                      ;
                      pcVar63 = "";
                      if (bVar67) {
                        pcVar63 = ", ";
                      }
                      pXVar61 = (X509_CINF *)((long)&pXVar61->version + (ulong)bVar67);
                      pXVar62 = pXVar61;
                      for (; pXVar61 < pXVar50; pXVar61 = (X509_CINF *)((long)&pXVar61->version + 1)
                          ) {
                        if (*(char *)((long)&pXVar31->sig_alg->algorithm + (long)pXVar61) != ' ') {
                          iVar7 = curl_msnprintf((char *)buffer,
                                                 (size_t)(&stack0xfffffffffffff7c8 + -(long)buffer),
                                                 "%s%c",pcVar63);
                          buffer = (BIGNUM **)((long)buffer + (long)iVar7);
                          pXVar50 = local_c38->cert_info;
                          pXVar31 = local_c38;
                          pXVar62 = pXVar61;
                          break;
                        }
                        pXVar62 = pXVar50;
                      }
                      pXVar61 = (X509_CINF *)((long)&pXVar62->version + 1);
                    } while (pXVar61 < pXVar50);
                  }
                  pCVar54 = local_c48;
                  iVar7 = (int)local_c68;
                  Curl_ssl_push_certinfo
                            (local_c48,(int)local_c68,(char *)local_bb8,(char *)local_a38);
                  BIO_free(pBVar30);
                  iVar10 = iVar10 + 1;
                  iVar11 = OPENSSL_sk_num(uVar27);
                } while (iVar10 < iVar11);
              }
              pAVar32 = (ASN1_TIME *)X509_get0_notBefore(pXVar24);
              pCVar23 = local_c60;
              ASN1_TIME_print((BIO *)local_c60,pAVar32);
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              Curl_ssl_push_certinfo_len(pCVar54,iVar7,"Start date",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              pAVar32 = (ASN1_TIME *)X509_get0_notAfter(pXVar24);
              ASN1_TIME_print((BIO *)pCVar23,pAVar32);
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              Curl_ssl_push_certinfo_len(pCVar54,iVar7,"Expire date",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              pEVar33 = X509_get_pubkey(pXVar24);
              if (pEVar33 == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar54,"   Unable to load public key\n");
              }
              else {
                iVar7 = EVP_PKEY_get_id(pEVar33);
                if (iVar7 == 0x74) {
                  uVar27 = EVP_PKEY_get0_DSA(pEVar33);
                  DSA_get0_pqg(uVar27,local_a38,local_bb8,&local_c38);
                  DSA_get0_key(uVar27,&local_c18,0);
                  pcVar63 = "dsa";
                  iVar7 = (int)local_c68;
LAB_00496799:
                  pCVar54 = local_c48;
                  pCVar23 = local_c60;
                  pubkey_show(local_c48,(BIO *)local_c60,iVar7,pcVar63,"p",(BIGNUM *)local_a38[0]);
                  pubkey_show(pCVar54,(BIO *)pCVar23,iVar7,pcVar63,"q",(BIGNUM *)local_bb8[0]);
                  pubkey_show(pCVar54,(BIO *)pCVar23,iVar7,pcVar63,"g",(BIGNUM *)local_c38);
                  pcVar17 = "pub_key";
                  pBVar39 = local_c18;
LAB_004967fd:
                  pubkey_show(pCVar54,(BIO *)pCVar23,iVar7,pcVar63,pcVar17,(BIGNUM *)pBVar39);
                }
                else {
                  if (iVar7 == 0x1c) {
                    uVar27 = EVP_PKEY_get0_DH(pEVar33);
                    DH_get0_pqg(uVar27,local_a38,local_bb8,&local_c38);
                    DH_get0_key(uVar27,&local_c18,0);
                    pcVar63 = "dh";
                    iVar7 = (int)local_c68;
                    goto LAB_00496799;
                  }
                  if (iVar7 == 6) {
                    uVar27 = EVP_PKEY_get0_RSA(pEVar33);
                    RSA_get0_key(uVar27,local_a38,local_bb8,0);
                    pCVar23 = local_c60;
                    BN_print(local_c60,local_a38[0]);
                    sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
                    pCVar54 = local_c48;
                    iVar7 = (int)local_c68;
                    Curl_ssl_push_certinfo_len
                              (local_c48,(int)local_c68,"RSA Public Key",(char *)local_c70,sVar26);
                    BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
                    pubkey_show(pCVar54,(BIO *)pCVar23,iVar7,"rsa","n",(BIGNUM *)local_a38[0]);
                    pcVar63 = "rsa";
                    pcVar17 = "e";
                    pBVar39 = local_bb8[0];
                    goto LAB_004967fd;
                  }
                }
                EVP_PKEY_free(pEVar33);
              }
              pCVar23 = local_c60;
              if (local_bf0 != (ASN1_GENERALIZEDTIME *)0x0) {
                if (0 < local_bf0->length) {
                  lVar55 = 0;
                  do {
                    BIO_printf((BIO *)pCVar23,"%02x:",(ulong)local_bf0->data[lVar55]);
                    lVar55 = lVar55 + 1;
                  } while (lVar55 < local_bf0->length);
                }
                sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
                Curl_ssl_push_certinfo_len
                          (local_c48,(int)local_c68,"Signature",(char *)local_c70,sVar26);
                BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              }
              pCVar23 = local_c60;
              PEM_write_bio_X509((BIO *)local_c60,pXVar24);
              sVar26 = BIO_ctrl((BIO *)pCVar23,3,0,&local_c70);
              pCVar54 = local_c48;
              iVar10 = (int)local_c68;
              Curl_ssl_push_certinfo_len(local_c48,(int)local_c68,"Cert",(char *)local_c70,sVar26);
              BIO_ctrl((BIO *)pCVar23,1,0,(void *)0x0);
              iVar10 = iVar10 + 1;
            } while (iVar10 != (int)local_c28);
          }
          BIO_free((BIO *)pCVar23);
          pCVar23 = local_c50;
          bVar65 = (byte)local_c40;
        }
      }
    }
    pXVar34 = (X509 *)SSL_get1_peer_certificate((conn->ssl[lVar52].backend)->handle);
    (conn->ssl[lVar52].backend)->server_cert = pXVar34;
    if (pXVar34 == (X509 *)0x0) {
      BIO_free(local_c08);
      lVar55 = local_c20;
      if (bVar65 != 0) {
        Curl_failf(pCVar23,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      local_c40 = CONCAT71(local_c40._1_7_,bVar65);
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar63 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar63 = "Server";
        }
      }
      else {
        pcVar63 = "Server";
      }
      Curl_infof(pCVar23,"%s certificate:\n",pcVar63);
      pXVar25 = X509_get_subject_name((X509 *)(conn->ssl[lVar52].backend)->server_cert);
      iVar7 = x509_name_oneline((X509_NAME *)pXVar25,&stack0xfffffffffffff7c8,size);
      pcVar63 = "[NONE]";
      if (iVar7 == 0) {
        pcVar63 = &stack0xfffffffffffff7c8;
      }
      Curl_infof(pCVar23," subject: %s\n",pcVar63);
      pAVar32 = (ASN1_TIME *)X509_get0_notBefore((conn->ssl[lVar52].backend)->server_cert);
      pBVar30 = local_c08;
      ASN1_TIME_print(local_c08,pAVar32);
      lVar55 = BIO_ctrl(pBVar30,3,0,&local_bc0);
      Curl_infof(pCVar23," start date: %.*s\n",lVar55);
      BIO_ctrl(pBVar30,1,0,(void *)0x0);
      pAVar32 = (ASN1_TIME *)X509_get0_notAfter((conn->ssl[lVar52].backend)->server_cert);
      ASN1_TIME_print(pBVar30,pAVar32);
      lVar55 = BIO_ctrl(pBVar30,3,0,&local_bc0);
      Curl_infof(pCVar23," expire date: %.*s\n",lVar55);
      BIO_ctrl(pBVar30,1,0,(void *)0x0);
      BIO_free(pBVar30);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x48 & 2) != 0) {
          pXVar24 = (X509 *)(conn->ssl[lVar52].backend)->server_cert;
          local_c58 = conn->data;
          lVar55 = 0x168;
          lVar46 = 0x160;
LAB_00496b3f:
          pCVar54 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar46 + -0x20);
          local_c28 = *(char **)((conn->chunk).hexbuffer + lVar55 + -0x20);
          local_c60 = pCVar54;
          if ((((conn->bits).field_0x5 & 2) == 0) ||
             (iVar7 = inet_pton(10,(char *)pCVar54,local_a38), iVar7 == 0)) {
            iVar7 = inet_pton(2,(char *)pCVar54,local_a38);
            local_c88 = (size_t)((uint)(iVar7 != 0) * 4);
            iVar7 = (uint)(iVar7 != 0) * 5 + 2;
          }
          else {
            iVar7 = 7;
            local_c88 = 0x10;
          }
          uVar27 = 0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar24,0x55,(int *)0x0,(int *)0x0);
          if (a_00 != (GENERAL_NAMES *)0x0) {
            iVar10 = OPENSSL_sk_num(a_00);
            if (0 < iVar10) {
              local_c68 = (Curl_easy *)((ulong)local_c68 & 0xffffffff00000000);
              local_c48 = (Curl_easy *)((ulong)local_c48 & 0xffffffff00000000);
              uVar37 = 0;
              iVar11 = 0;
              local_c50 = pCVar23;
              local_be0 = pXVar24;
LAB_00496c04:
              local_c08 = (BIO *)CONCAT44(local_c08._4_4_,(int)uVar37);
              do {
                piVar35 = (int *)OPENSSL_sk_value(a_00,iVar11);
                iVar12 = *piVar35;
                uVar48 = (undefined7)((ulong)uVar27 >> 8);
                if (iVar12 == 2) {
                  uVar27 = CONCAT71(uVar48,1);
                  local_c68 = (Curl_easy *)CONCAT44(local_c68._4_4_,(int)uVar27);
                }
                else if (iVar12 == 7) {
                  uVar27 = CONCAT71(uVar48,1);
                  local_c48 = (Curl_easy *)CONCAT44(local_c48._4_4_,(int)uVar27);
                }
                if (iVar12 == iVar7) {
                  pcVar63 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar35 + 2));
                  iVar12 = ASN1_STRING_length(*(ASN1_STRING **)(piVar35 + 2));
                  if (iVar7 == 7) {
                    if ((local_c88 == (long)iVar12) &&
                       (iVar12 = bcmp(pcVar63,local_a38,local_c88), iVar12 == 0)) goto LAB_00496caa;
                  }
                  else if (((iVar7 == 2) && (sVar36 = strlen(pcVar63), sVar36 == (long)iVar12)) &&
                          (iVar12 = Curl_cert_hostcheck(pcVar63,(char *)local_c60), iVar12 != 0)) {
                    Curl_infof(local_c58," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                               local_c28,pcVar63);
                    goto LAB_00497e17;
                  }
                }
                iVar11 = iVar11 + 1;
                if (iVar10 <= iVar11) {
                  GENERAL_NAMES_free(a_00);
                  pcVar63 = local_c28;
                  pCVar54 = local_c58;
                  pCVar23 = local_c50;
                  if (((ulong)local_c08 & 1) != 0) goto LAB_0049759d;
                  pXVar24 = local_be0;
                  if ((((byte)local_c68 | (byte)local_c48) & 1) == 0) goto LAB_0049715e;
                  Curl_infof(local_c58," subjectAltName does not match %s\n",local_c28);
                  Curl_failf(pCVar54,
                             "SSL: no alternative certificate subject name matches target host name \'%s\'"
                             ,pcVar63);
                  goto LAB_00497153;
                }
              } while( true );
            }
            GENERAL_NAMES_free(a_00);
          }
LAB_0049715e:
          local_bb8[0] = (BIGNUM *)0x5112de;
          pXVar25 = X509_get_subject_name(pXVar24);
          if (pXVar25 == (X509_NAME *)0x0) {
LAB_004974e9:
            if (local_bb8[0] == (BIGNUM *)0x5112de) {
              local_bb8[0] = (BIGNUM *)0x0;
              goto LAB_00497540;
            }
            if (local_bb8[0] == (BIGNUM *)0x0) goto LAB_00497540;
            iVar7 = Curl_cert_hostcheck((char *)local_bb8[0],(char *)local_c60);
            if (iVar7 == 0) {
              Curl_failf(local_c58,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,local_bb8[0],local_c28);
              goto LAB_00497553;
            }
            CVar9 = CURLE_OK;
            Curl_infof(local_c58," common name: %s (matched)\n");
          }
          else {
            iVar7 = -1;
            do {
              iVar10 = iVar7;
              iVar7 = X509_NAME_get_index_by_NID(pXVar25,0xd,iVar10);
            } while (-1 < iVar7);
            if (iVar10 < 0) goto LAB_004974e9;
            ne = X509_NAME_get_entry(pXVar25,iVar10);
            pAVar29 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar29 == (ASN1_STRING *)0x0) goto LAB_004974e9;
            iVar7 = ASN1_STRING_type(pAVar29);
            if (iVar7 == 0xc) {
              uVar8 = ASN1_STRING_length(pAVar29);
              if ((int)uVar8 < 0) {
                pBVar39 = (BIGNUM *)0x5112de;
              }
              else {
                pBVar39 = (BIGNUM *)
                          CRYPTO_malloc(uVar8 + 1,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmcurl/lib/vtls/openssl.c"
                                        ,0x66c);
                local_bb8[0] = pBVar39;
                if (pBVar39 == (BIGNUM *)0x0) goto LAB_00497540;
                __src = (void *)ASN1_STRING_get0_data(pAVar29);
                memcpy(pBVar39,__src,(ulong)uVar8);
                *(uchar *)((long)&pBVar39->d + (ulong)uVar8) = '\0';
              }
LAB_004974d0:
              sVar36 = strlen((char *)pBVar39);
              uVar14 = curlx_uztosi(sVar36);
              if (uVar14 == uVar8) goto LAB_004974e9;
              Curl_failf(local_c58,"SSL: illegal cert name field");
              CVar9 = CURLE_PEER_FAILED_VERIFICATION;
              if (local_bb8[0] == (BIGNUM *)0x5112de) {
LAB_00497153:
                CVar9 = CURLE_PEER_FAILED_VERIFICATION;
                goto LAB_0049757f;
              }
              goto LAB_00497564;
            }
            uVar8 = ASN1_STRING_to_UTF8((uchar **)local_bb8,pAVar29);
            pBVar39 = local_bb8[0];
            if (local_bb8[0] != (BIGNUM *)0x0) goto LAB_004974d0;
LAB_00497540:
            Curl_failf(local_c58,"SSL: unable to obtain common name from peer certificate");
LAB_00497553:
            CVar9 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_00497564:
          if (local_bb8[0] != (BIGNUM *)0x0) {
            CRYPTO_free(local_bb8[0]);
          }
          if (CVar9 != CURLE_OK) {
LAB_0049757f:
            X509_free((X509 *)(conn->ssl[lVar52].backend)->server_cert);
            (conn->ssl[lVar52].backend)->server_cert = (X509 *)0x0;
            return CVar9;
          }
        }
      }
      else if (((conn->ssl_config).field_0x48 & 2) != 0) {
        pXVar24 = (X509 *)(conn->ssl[lVar52].backend)->server_cert;
        local_c58 = conn->data;
        lVar55 = 0xd8;
        lVar46 = 0xd0;
        goto LAB_00496b3f;
      }
LAB_0049759d:
      pXVar25 = X509_get_issuer_name((X509 *)(conn->ssl[lVar52].backend)->server_cert);
      iVar7 = x509_name_oneline((X509_NAME *)pXVar25,&stack0xfffffffffffff7c8,size_00);
      if (iVar7 == 0) {
        Curl_infof(pCVar23," issuer: %s\n",&stack0xfffffffffffff7c8);
        pcVar63 = local_c30;
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar17 = (pCVar23->set).proxy_ssl.issuercert;
        }
        else {
          pcVar17 = (pCVar23->set).ssl.issuercert;
        }
        if (pcVar17 != (char *)0x0) {
          pBVar21 = BIO_s_file();
          pBVar30 = BIO_new(pBVar21);
          if (pBVar30 == (BIO *)0x0) {
            uVar20 = ERR_get_error();
            ERR_error_string_n(uVar20,(char *)&local_b38,0x100);
            Curl_failf(pCVar23,"BIO_new return NULL, OpenSSL error %s",&local_b38);
            X509_free((X509 *)(conn->ssl[lVar52].backend)->server_cert);
            (conn->ssl[lVar52].backend)->server_cert = (X509 *)0x0;
            return CURLE_OUT_OF_MEMORY;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar55 = 0xb50, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar55 = 0xaa8;
          }
          lVar55 = BIO_ctrl(pBVar30,0x6c,3,*(void **)((long)&pCVar23->next + lVar55));
          if ((int)lVar55 < 1) {
            if ((byte)local_c40 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar55 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar55 = 0xaa8;
              }
              Curl_failf(pCVar23,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)&pCVar23->next + lVar55));
            }
            BIO_free(pBVar30);
            goto LAB_004978aa;
          }
          pXVar24 = PEM_read_bio_X509(pBVar30,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar24 == (X509 *)0x0) {
            if ((byte)local_c40 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar55 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar55 = 0xaa8;
              }
              Curl_failf(pCVar23,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)&pCVar23->next + lVar55));
            }
            BIO_free(pBVar30);
            pXVar24 = (X509 *)0x0;
          }
          else {
            iVar7 = X509_check_issued(pXVar24,(X509 *)(conn->ssl[lVar52].backend)->server_cert);
            if (iVar7 == 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar55 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar55 = 0xaa8;
              }
              Curl_infof(pCVar23," SSL certificate issuer check ok (%s)\n",
                         *(undefined8 *)((long)&pCVar23->next + lVar55));
              BIO_free(pBVar30);
              X509_free(pXVar24);
              goto LAB_0049792c;
            }
            if ((byte)local_c40 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar55 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar55 = 0xaa8;
              }
              Curl_failf(pCVar23,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)&pCVar23->next + lVar55));
            }
            BIO_free(pBVar30);
          }
          X509_free(pXVar24);
LAB_004978aa:
          X509_free((X509 *)(conn->ssl[lVar52].backend)->server_cert);
          (conn->ssl[lVar52].backend)->server_cert = (X509 *)0x0;
          return CURLE_SSL_ISSUER_ERROR;
        }
LAB_0049792c:
        lVar55 = SSL_get_verify_result((SSL *)(conn->ssl[lVar52].backend)->handle);
        *(long *)((long)&pCVar23->next + (long)pcVar63) = lVar55;
        if (lVar55 == 0) {
          CVar9 = CURLE_OK;
          Curl_infof(pCVar23," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            bVar65 = (conn->proxy_ssl_config).field_0x48;
          }
          else {
            bVar65 = (conn->ssl_config).field_0x48;
          }
          if ((bVar65 & 1) == 0) {
            pcVar63 = X509_verify_cert_error_string(lVar55);
            CVar9 = CURLE_OK;
            Curl_infof(pCVar23," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                       pcVar63,lVar55);
          }
          else {
            CVar9 = CURLE_PEER_FAILED_VERIFICATION;
            if ((byte)local_c40 != '\0') {
              pcVar63 = X509_verify_cert_error_string(lVar55);
              Curl_failf(pCVar23,"SSL certificate verify result: %s (%ld)",pcVar63,lVar55);
            }
          }
        }
        cVar60 = (byte)local_c40;
      }
      else {
        CVar9 = CURLE_PEER_FAILED_VERIFICATION;
        cVar60 = (byte)local_c40;
        if ((byte)local_c40 != '\0') {
          Curl_failf(pCVar23,"SSL: couldn\'t get X509-issuer name!");
        }
      }
      cVar13 = (conn->http_proxy).proxytype;
      if ((cVar13 == CURLPROXY_HTTPS) &&
         (iVar7 = conn->sock[1], conn->proxy_ssl[iVar7 != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x48 & 4) == 0) {
          CVar15 = CURLE_OK;
          if (cVar60 != '\0') {
            CVar15 = CVar9;
          }
          goto LAB_00497a5a;
        }
LAB_00497a86:
        pCVar54 = conn->data;
        lVar55 = SSL_ctrl((SSL *)(conn->ssl[lVar52].backend)->handle,0x46,0,local_a38);
        if (local_a38[0] == (BIGNUM *)0x0) {
          resp = (OCSP_RESPONSE *)0x0;
          Curl_failf(pCVar54,"No OCSP response received");
          lVar55 = local_c20;
LAB_00497c3d:
          OCSP_RESPONSE_free(resp);
          CVar15 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          local_bb8[0] = local_a38[0];
          local_c68 = pCVar54;
          resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)local_bb8,lVar55);
          lVar55 = local_c20;
          if (resp == (OCSP_RESPONSE *)0x0) {
            resp = (OCSP_RESPONSE *)0x0;
LAB_00497c31:
            Curl_failf(local_c68,"Invalid OCSP response");
            goto LAB_00497c3d;
          }
          local_c50 = pCVar23;
          uVar8 = OCSP_response_status(resp);
          if (uVar8 != 0) {
            pcVar63 = OCSP_response_status_str((long)(int)uVar8);
            Curl_failf(local_c68,"Invalid OCSP response status: %s (%d)",pcVar63,(ulong)uVar8);
            goto LAB_00497c3d;
          }
          pCVar23 = (Curl_easy *)OCSP_response_get1_basic(resp);
          if (pCVar23 == (Curl_easy *)0x0) goto LAB_00497c31;
          certs = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar52].backend)->handle);
          pXVar40 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar52].backend)->ctx);
          CVar15 = CURLE_OK;
          iVar7 = OCSP_basic_verify((OCSP_BASICRESP *)pCVar23,certs,pXVar40,0);
          local_c48 = pCVar23;
          if (iVar7 < 1) {
            bVar67 = false;
            Curl_failf(local_c68,"OCSP response verification failed");
            CVar15 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            iVar7 = OCSP_resp_count((OCSP_BASICRESP *)pCVar23);
            bVar67 = true;
            if (0 < iVar7) {
              iVar7 = 0;
              pCVar23 = local_c48;
              do {
                single = OCSP_resp_get0((OCSP_BASICRESP *)pCVar23,iVar7);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar8 = OCSP_single_get0_status
                                    (single,(int *)&local_c18,(ASN1_GENERALIZEDTIME **)&local_c38,
                                     &local_c70,&local_bf0);
                  iVar10 = OCSP_check_validity(local_c70,local_bf0,300,-1);
                  if (iVar10 == 0) {
                    Curl_failf(local_c68,"OCSP response has expired");
                  }
                  else {
                    pcVar63 = OCSP_cert_status_str((long)(int)uVar8);
                    Curl_infof(local_c68,"SSL certificate status: %s (%d)\n",pcVar63,(ulong)uVar8);
                    if (uVar8 != 2) {
                      pCVar23 = local_c48;
                      if (uVar8 != 1) goto LAB_00497d75;
                      pcVar63 = OCSP_crl_reason_str((long)(int)local_c18);
                      Curl_failf(local_c68,"SSL certificate revocation reason: %s (%d)",pcVar63,
                                 (ulong)local_c18 & 0xffffffff);
                    }
                  }
                  CVar15 = CURLE_SSL_INVALIDCERTSTATUS;
                  bVar67 = false;
                  goto LAB_004988ce;
                }
LAB_00497d75:
                iVar7 = iVar7 + 1;
                iVar10 = OCSP_resp_count((OCSP_BASICRESP *)pCVar23);
              } while (iVar7 < iVar10);
              CVar15 = CURLE_OK;
            }
          }
LAB_004988ce:
          pCVar23 = local_c50;
          OCSP_BASICRESP_free((OCSP_BASICRESP *)local_c48);
          OCSP_RESPONSE_free(resp);
          lVar55 = local_c20;
          if (bVar67) {
            cVar13 = (conn->http_proxy).proxytype;
            CVar9 = CURLE_OK;
            goto LAB_00497a22;
          }
        }
        X509_free((X509 *)(conn->ssl[lVar52].backend)->server_cert);
        (conn->ssl[lVar52].backend)->server_cert = (X509 *)0x0;
      }
      else {
        if (((conn->ssl_config).field_0x48 & 4) != 0) goto LAB_00497a86;
LAB_00497a22:
        CVar15 = CURLE_OK;
        if (cVar60 != '\0') {
          CVar15 = CVar9;
        }
        lVar46 = 0xd10;
        if (cVar13 == CURLPROXY_HTTPS) {
          iVar7 = conn->sock[1];
LAB_00497a5a:
          lVar46 = (ulong)(conn->proxy_ssl[iVar7 != -1].state != ssl_connection_complete) * 8 +
                   0xd10;
        }
        lVar55 = local_c20;
        pcVar63 = *(char **)((long)&pCVar23->next + lVar46);
        local_bc0 = pcVar63;
        if ((CVar15 == CURLE_OK) && (pcVar63 != (char *)0x0)) {
          pXVar34 = (conn->ssl[lVar52].backend)->server_cert;
          local_c50 = pCVar23;
          if (pXVar34 == (X509 *)0x0) {
LAB_00497d9b:
            CVar15 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            pCVar23 = local_c50;
          }
          else {
            pXVar38 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar34);
            uVar8 = i2d_X509_PUBKEY(pXVar38,(uchar **)0x0);
            if ((int)uVar8 < 1) goto LAB_00497d9b;
            uVar20 = (ulong)uVar8;
            pBVar39 = (BIGNUM *)(*Curl_cmalloc)(uVar20);
            local_a38[0] = pBVar39;
            if (pBVar39 == (BIGNUM *)0x0) goto LAB_00497d9b;
            pXVar38 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar34);
            uVar14 = i2d_X509_PUBKEY(pXVar38,(uchar **)local_a38);
            pCVar23 = local_c50;
            if (((long)local_a38[0] - (long)pBVar39 != uVar20 || uVar8 != uVar14) ||
                local_a38[0] == (BIGNUM *)0x0) {
              (*Curl_cfree)(pBVar39);
              goto LAB_00497d9b;
            }
            CVar15 = Curl_pin_peer_pubkey(local_c50,pcVar63,(uchar *)pBVar39,uVar20);
            (*Curl_cfree)(pBVar39);
            if (CVar15 == CURLE_OK) {
              CVar15 = CURLE_OK;
              goto LAB_00497dbc;
            }
          }
          Curl_failf(pCVar23,"SSL: public key does not match pinned public key!");
        }
LAB_00497dbc:
        X509_free((X509 *)(conn->ssl[lVar52].backend)->server_cert);
        (conn->ssl[lVar52].backend)->server_cert = (X509 *)0x0;
        conn->ssl[lVar52].connecting_state = ssl_connect_done;
      }
      if (CVar15 != CURLE_OK) {
        return CVar15;
      }
    }
  }
  else {
    lVar55 = local_c20;
    if (sVar6 != ssl_connect_done) {
      _Var5 = false;
      goto LAB_00495d5e;
    }
  }
  conn->ssl[lVar52].state = ssl_connection_complete;
  conn->recv[lVar55] = ossl_recv;
  conn->send[lVar55] = ossl_send;
  _Var5 = true;
LAB_00495d5e:
  *local_bf8 = _Var5;
  conn->ssl[lVar52].connecting_state = ssl_connect_1;
  return CURLE_OK;
LAB_00496caa:
  Curl_infof(local_c58," subjectAltName: host \"%s\" matched cert\'s IP address!\n",local_c28);
  iVar11 = iVar11 + 1;
  uVar37 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if (iVar10 <= iVar11) goto LAB_00497e17;
  goto LAB_00496c04;
LAB_00497e17:
  GENERAL_NAMES_free(a_00);
  pCVar23 = local_c50;
  goto LAB_0049759d;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}